

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int UTF16BEToUTF8(uchar *out,int *outlen,uchar *inb,int *inlenb)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int local_74;
  int bits;
  uchar *tmp;
  uint local_60;
  uint inlen;
  uint d;
  uint c;
  unsigned_short *inend;
  unsigned_short *in;
  uchar *outend;
  uchar *processed;
  uchar *outstart;
  int *inlenb_local;
  uchar *inb_local;
  int *outlen_local;
  uchar *out_local;
  
  iVar2 = *outlen;
  if (*inlenb % 2 == 1) {
    *inlenb = *inlenb + -1;
  }
  iVar3 = *inlenb;
  outend = inb;
  outlen_local = (int *)out;
  while( true ) {
    iVar4 = (int)outlen_local;
    iVar5 = (int)out;
    iVar6 = (int)outend;
    iVar7 = (int)inb;
    if (inb + (ulong)(uint)(iVar3 / 2) * 2 <= outend) break;
    if (xmlLittleEndian == 0) {
      uVar1 = *(ushort *)outend;
    }
    else {
      uVar1 = CONCAT11(*outend,outend[1]);
    }
    inend = (unsigned_short *)(outend + 2);
    inlen = (uint)uVar1;
    if ((inlen & 0xfc00) == 0xd800) {
      if (inb + (ulong)(uint)(iVar3 / 2) * 2 <= inend) {
        *outlen = iVar4 - iVar5;
        *inlenb = iVar6 - iVar7;
        return -2;
      }
      if (xmlLittleEndian == 0) {
        uVar1 = *inend;
      }
      else {
        uVar1 = CONCAT11((char)*inend,outend[3]);
      }
      inend = (unsigned_short *)(outend + 4);
      local_60 = (uint)uVar1;
      if ((local_60 & 0xfc00) != 0xdc00) {
        *outlen = iVar4 - iVar5;
        *inlenb = iVar6 - iVar7;
        return -2;
      }
      inlen = (local_60 & 0x3ff | (inlen & 0x3ff) << 10) + 0x10000;
    }
    if (out + iVar2 <= outlen_local) break;
    if (inlen < 0x80) {
      *(char *)outlen_local = (char)inlen;
      local_74 = -6;
    }
    else if (inlen < 0x800) {
      *(byte *)outlen_local = (byte)(inlen >> 6) & 0x1f | 0xc0;
      local_74 = 0;
    }
    else if (inlen < 0x10000) {
      *(byte *)outlen_local = (byte)(inlen >> 0xc) & 0xf | 0xe0;
      local_74 = 6;
    }
    else {
      *(byte *)outlen_local = (byte)(inlen >> 0x12) | 0xf0;
      local_74 = 0xc;
    }
    while ((outlen_local = (int *)((long)outlen_local + 1), -1 < local_74 &&
           (outlen_local < out + iVar2))) {
      *(byte *)outlen_local = (byte)(inlen >> ((byte)local_74 & 0x1f)) & 0x3f | 0x80;
      local_74 = local_74 + -6;
    }
    outend = (uchar *)inend;
  }
  *outlen = iVar4 - iVar5;
  *inlenb = iVar6 - iVar7;
  return *outlen;
}

Assistant:

static int
UTF16BEToUTF8(unsigned char* out, int *outlen,
            const unsigned char* inb, int *inlenb)
{
    unsigned char* outstart = out;
    const unsigned char* processed = inb;
    unsigned char* outend = out + *outlen;
    unsigned short* in = (unsigned short*) inb;
    unsigned short* inend;
    unsigned int c, d, inlen;
    unsigned char *tmp;
    int bits;

    if ((*inlenb % 2) == 1)
        (*inlenb)--;
    inlen = *inlenb / 2;
    inend= in + inlen;
    while (in < inend) {
	if (xmlLittleEndian) {
	    tmp = (unsigned char *) in;
	    c = *tmp++;
	    c = c << 8;
	    c = c | (unsigned int) *tmp;
	    in++;
	} else {
	    c= *in++;
	}
        if ((c & 0xFC00) == 0xD800) {    /* surrogates */
	    if (in >= inend) {           /* (in > inend) shouldn't happens */
		*outlen = out - outstart;
		*inlenb = processed - inb;
	        return(-2);
	    }
	    if (xmlLittleEndian) {
		tmp = (unsigned char *) in;
		d = *tmp++;
		d = d << 8;
		d = d | (unsigned int) *tmp;
		in++;
	    } else {
		d= *in++;
	    }
            if ((d & 0xFC00) == 0xDC00) {
                c &= 0x03FF;
                c <<= 10;
                c |= d & 0x03FF;
                c += 0x10000;
            }
            else {
		*outlen = out - outstart;
		*inlenb = processed - inb;
	        return(-2);
	    }
        }

	/* assertion: c is a single UTF-4 value */
        if (out >= outend)
	    break;
        if      (c <    0x80) {  *out++=  c;                bits= -6; }
        else if (c <   0x800) {  *out++= ((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
        else if (c < 0x10000) {  *out++= ((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
        else                  {  *out++= ((c >> 18) & 0x07) | 0xF0;  bits= 12; }

        for ( ; bits >= 0; bits-= 6) {
            if (out >= outend)
	        break;
            *out++= ((c >> bits) & 0x3F) | 0x80;
        }
	processed = (const unsigned char*) in;
    }
    *outlen = out - outstart;
    *inlenb = processed - inb;
    return(*outlen);
}